

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Vec_IntPushMem(Mem_Step_t *pMemMan,Vec_Int_t *p,int Entry)

{
  int iVar1;
  int local_2c;
  int *piStack_28;
  int i;
  int *pArray;
  int Entry_local;
  Vec_Int_t *p_local;
  Mem_Step_t *pMemMan_local;
  
  if (p->nSize == p->nCap) {
    if (p->nSize == 0) {
      p->nCap = 1;
    }
    if (pMemMan == (Mem_Step_t *)0x0) {
      piStack_28 = (int *)malloc((long)(p->nCap << 1) << 2);
    }
    else {
      piStack_28 = (int *)Mem_StepEntryFetch(pMemMan,p->nCap << 3);
    }
    if (p->pArray != (int *)0x0) {
      for (local_2c = 0; local_2c < p->nSize; local_2c = local_2c + 1) {
        piStack_28[local_2c] = p->pArray[local_2c];
      }
      if (pMemMan == (Mem_Step_t *)0x0) {
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
      }
      else {
        Mem_StepEntryRecycle(pMemMan,(char *)p->pArray,p->nCap << 2);
      }
    }
    p->nCap = p->nCap << 1;
    p->pArray = piStack_28;
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void Vec_IntPushMem( Mem_Step_t * pMemMan, Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        int * pArray;
        int i;

        if ( p->nSize == 0 )
            p->nCap = 1;
        if ( pMemMan )
            pArray = (int *)Mem_StepEntryFetch( pMemMan, p->nCap * 8 );
        else
            pArray = ABC_ALLOC( int, p->nCap * 2 );
        if ( p->pArray )
        {
            for ( i = 0; i < p->nSize; i++ )
                pArray[i] = p->pArray[i];
            if ( pMemMan )
                Mem_StepEntryRecycle( pMemMan, (char *)p->pArray, p->nCap * 4 );
            else
                ABC_FREE( p->pArray );
        }
        p->nCap *= 2;
        p->pArray = pArray;
    }
    p->pArray[p->nSize++] = Entry;
}